

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readComment(Reader *this)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  CommentPlacement placement;
  char *pcVar4;
  Location pCVar5;
  Location begin;
  bool bVar6;
  
  pcVar3 = this->current_;
  if (pcVar3 == this->end_) {
    return false;
  }
  this->current_ = pcVar3 + 1;
  cVar1 = *pcVar3;
  if (cVar1 == '*') {
    bVar6 = readCStyleComment(this);
    if (!bVar6) {
      return false;
    }
  }
  else {
    pcVar4 = pcVar3 + 1;
    if (cVar1 != '/') {
      return false;
    }
    while (pcVar4 != this->end_) {
      this->current_ = pcVar4 + 1;
      cVar2 = *pcVar4;
      if ((cVar2 == '\n') || (pcVar4 = pcVar4 + 1, cVar2 == '\r')) break;
    }
  }
  if (this->collectComments_ != true) {
    return true;
  }
  begin = pcVar3 + -1;
  pcVar3 = this->lastValueEnd_;
  placement = commentBefore;
  if (pcVar3 != (char *)0x0) {
    if (pcVar3 < begin) {
      bVar6 = true;
      do {
        if ((*pcVar3 == '\n') || (*pcVar3 == '\r')) break;
        pcVar3 = pcVar3 + 1;
        bVar6 = pcVar3 < begin;
      } while (pcVar3 != begin);
      placement = commentBefore;
      if (bVar6) goto LAB_005422e6;
    }
    if ((cVar1 == '*') && (pcVar3 = this->current_, begin < pcVar3)) {
      bVar6 = true;
      pCVar5 = begin;
      do {
        if ((*pCVar5 == '\n') || (*pCVar5 == '\r')) break;
        pCVar5 = pCVar5 + 1;
        bVar6 = pCVar5 < pcVar3;
      } while (pCVar5 != pcVar3);
      placement = commentBefore;
      if (bVar6) goto LAB_005422e6;
    }
    placement = commentAfterOnSameLine;
  }
LAB_005422e6:
  addComment(this,begin,this->current_,placement);
  return true;
}

Assistant:

Reader::Char Reader::getNextChar() {
  if (current_ == end_)
    return 0;
  return *current_++;
}